

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_class_desc(parser *p)

{
  wchar_t wVar1;
  long lVar2;
  parser_error pVar3;
  void *pvVar4;
  char *s2;
  char *pcVar5;
  long lVar6;
  
  pvVar4 = parser_priv(p);
  pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  if (pvVar4 != (void *)0x0) {
    wVar1 = *(wchar_t *)((long)pvVar4 + 0xf8);
    if (0 < (long)wVar1) {
      lVar2 = *(long *)((long)pvVar4 + 0x100);
      if ((lVar2 == 0) || (class_max_books < wVar1)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xfe2,"enum parser_error parse_class_desc(struct parser *)");
      }
      lVar6 = (long)wVar1 * 0x20;
      wVar1 = *(wchar_t *)(lVar2 + -0x14 + lVar6);
      if (0 < (long)wVar1) {
        lVar2 = *(long *)(lVar2 + lVar6 + -8);
        if ((lVar2 == 0) || (book_max_spells < wVar1)) {
          __assert_fail("book->spells && book->num_spells <= book_max_spells",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                        ,0xfe8,"enum parser_error parse_class_desc(struct parser *)");
        }
        lVar6 = (long)wVar1 * 0x38;
        pcVar5 = *(char **)(lVar2 + -0x30 + lVar6);
        s2 = parser_getstr(p,"desc");
        pcVar5 = string_append(pcVar5,s2);
        *(char **)(lVar2 + -0x30 + lVar6) = pcVar5;
        pVar3 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_class_desc(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	spell->text = string_append(spell->text, parser_getstr(p, "desc"));
	return PARSE_ERROR_NONE;
}